

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void delete_insn_data(MIR_insn_t insn)

{
  void *__ptr;
  uint uVar1;
  
  __ptr = insn->data;
  if (((__ptr != (void *)0x0) && (uVar1 = *(int *)&insn->field_0x18 - 0xa7, uVar1 < 0xe)) &&
     ((0x2007U >> (uVar1 & 0x1f) & 1) != 0)) {
    if ((uVar1 < 3) && (*(bitmap_t *)((long)__ptr + 8) != (bitmap_t)0x0)) {
      bitmap_destroy(*(bitmap_t *)((long)__ptr + 8));
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static void delete_insn_data (MIR_insn_t insn) {
  insn_data_t insn_data = insn->data;

  if (insn_data == NULL || !insn_data_p (insn)) return;
  if (MIR_call_code_p (insn->code) && insn_data->u.call_hard_reg_args != NULL)
    bitmap_destroy (insn_data->u.call_hard_reg_args);
  free (insn_data);
}